

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_deploymentinfo(any *context,HTTPRequest *req,string *str_uri_part)

{
  string_view str;
  string_view reply;
  bool bVar1;
  RESTResponseFormat RVar2;
  ChainstateManager *req_00;
  CBlockIndex *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  RESTResponseFormat rf;
  ChainstateManager *chainman;
  optional<uint256> hash;
  JSONRPCRequest jsonRequest;
  string hash_str;
  JSONRPCRequest *in_stack_fffffffffffffa88;
  undefined6 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa96;
  undefined1 in_stack_fffffffffffffa97;
  UniValue *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  VType in_stack_fffffffffffffaa4;
  UniValue *in_stack_fffffffffffffaa8;
  JSONRPCRequest *in_stack_fffffffffffffab0;
  anon_class_16_2_fb67514e *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  allocator<char> *paVar4;
  UniValue *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  string *message;
  undefined8 in_stack_fffffffffffffae8;
  HTTPStatusCode HVar5;
  HTTPRequest *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  string *in_stack_fffffffffffffb00;
  bool local_485;
  allocator<char> local_484;
  allocator<char> local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  undefined1 *local_480;
  undefined1 *local_478;
  undefined8 in_stack_fffffffffffffb90;
  RPCHelpMan *in_stack_fffffffffffffb98;
  undefined1 local_390 [88];
  UniValue local_338 [3];
  undefined1 local_219 [281];
  UniValue local_100 [2];
  long local_8;
  
  HVar5 = (HTTPStatusCode)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup((HTTPRequest *)in_stack_fffffffffffffac0);
  if (!bVar1) {
    local_485 = false;
    goto LAB_0125ffeb;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  RVar2 = ParseDataFormat(in_stack_fffffffffffffb00,
                          (string *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8));
  if (RVar2 == JSON) {
    JSONRPCRequest::JSONRPCRequest(in_stack_fffffffffffffab0);
    std::any::operator=((any *)in_stack_fffffffffffffa98,
                        (any *)CONCAT17(in_stack_fffffffffffffa97,
                                        CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90
                                                )));
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    UniValue::UniValue(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa4,
                       (string *)in_stack_fffffffffffffa98);
    UniValue::operator=(in_stack_fffffffffffffa98,
                        (UniValue *)
                        CONCAT17(in_stack_fffffffffffffa97,
                                 CONCAT16(in_stack_fffffffffffffa96,in_stack_fffffffffffffa90)));
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa88);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa88);
    if (bVar1) {
LAB_0125fbfa:
      paVar4 = &local_482;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                 (allocator<char> *)in_stack_fffffffffffffac8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                 (allocator<char> *)in_stack_fffffffffffffac8);
      HTTPRequest::WriteHeader
                ((HTTPRequest *)in_stack_fffffffffffffaa8,
                 (string *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (string *)in_stack_fffffffffffffa98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88);
      std::allocator<char>::~allocator(&local_483);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88);
      std::allocator<char>::~allocator(&local_482);
      getdeploymentinfo();
      RPCHelpMan::HandleRequest
                (in_stack_fffffffffffffb98,(JSONRPCRequest *)in_stack_fffffffffffffb90);
      UniValue::write_abi_cxx11_(local_338,(int)local_390,(void *)0x0,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                     (char *)in_stack_fffffffffffffa98);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
      reply._M_str = (char *)in_stack_fffffffffffffac8;
      reply._M_len = (size_t)paVar4;
      HTTPRequest::WriteReply((HTTPRequest *)in_RSI,in_stack_fffffffffffffaa4,reply);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa88);
      RPCHelpMan::~RPCHelpMan((RPCHelpMan *)in_stack_fffffffffffffa88);
      local_485 = true;
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8);
      str._M_len._4_4_ = in_stack_fffffffffffffaa4;
      str._M_len._0_4_ = in_stack_fffffffffffffaa0;
      str._M_str = (char *)in_stack_fffffffffffffaa8;
      uint256::FromHex(str);
      bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffffa88);
      if (bVar1) {
        req_00 = GetChainman((any *)in_stack_fffffffffffffac8,
                             (HTTPRequest *)in_stack_fffffffffffffac0);
        if (req_00 == (ChainstateManager *)0x0) {
          local_485 = false;
        }
        else {
          in_stack_fffffffffffffb90 = req_00;
          MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                    ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa88);
          local_480 = &stack0xfffffffffffffb90;
          local_478 = local_219;
          pCVar3 = rest_deploymentinfo::anon_class_16_2_fb67514e::operator()
                             (in_stack_fffffffffffffab8);
          if (pCVar3 != (CBlockIndex *)0x0) {
            in_stack_fffffffffffffac8 = local_100;
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
            UniValue::push_back((UniValue *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                in_stack_fffffffffffffa98);
            UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa88);
            goto LAB_0125fbfa;
          }
          message = (string *)&local_481;
          std::allocator<char>::allocator();
          HVar5 = (HTTPStatusCode)((ulong)pCVar3 >> 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    (in_RSI,(char *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                     (allocator<char> *)in_stack_fffffffffffffac8);
          local_485 = RESTERR((HTTPRequest *)req_00,HVar5,message);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa88);
          std::allocator<char>::~allocator(&local_481);
        }
      }
      else {
        std::operator+((char *)in_stack_fffffffffffffad8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
        local_485 = RESTERR(in_stack_fffffffffffffaf0,HVar5,in_stack_fffffffffffffae0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa88);
      }
    }
    JSONRPCRequest::~JSONRPCRequest(in_stack_fffffffffffffa88);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffad8,
               (char *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
               (allocator<char> *)in_stack_fffffffffffffac8);
    local_485 = RESTERR(in_stack_fffffffffffffaf0,HVar5,in_stack_fffffffffffffae0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa88);
    std::allocator<char>::~allocator(&local_484);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88);
LAB_0125ffeb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_485;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_deploymentinfo(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req)) return false;

    std::string hash_str;
    const RESTResponseFormat rf = ParseDataFormat(hash_str, str_uri_part);

    switch (rf) {
    case RESTResponseFormat::JSON: {
        JSONRPCRequest jsonRequest;
        jsonRequest.context = context;
        jsonRequest.params = UniValue(UniValue::VARR);

        if (!hash_str.empty()) {
            auto hash{uint256::FromHex(hash_str)};
            if (!hash) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hash_str);
            }

            const ChainstateManager* chainman = GetChainman(context, req);
            if (!chainman) return false;
            if (!WITH_LOCK(::cs_main, return chainman->m_blockman.LookupBlockIndex(*hash))) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Block not found");
            }

            jsonRequest.params.push_back(hash_str);
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, getdeploymentinfo().HandleRequest(jsonRequest).write() + "\n");
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }

}